

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O0

void __thiscall
JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::update_sequence_point
          (JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this)

{
  bool bVar1;
  HalfCycles local_40;
  HalfCycles local_38;
  WrappedInt<HalfCycles> local_30;
  WrappedInt<HalfCycles> local_28;
  WrappedInt<HalfCycles> local_20;
  WrappedInt<HalfCycles> local_18;
  HalfCycles time;
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this_local;
  
  time.super_WrappedInt<HalfCycles>.length_ = (WrappedInt<HalfCycles>)(WrappedInt<HalfCycles>)this;
  local_18.length_ = (IntType)Motorola::MFP68901::MFP68901::next_sequence_point(&this->object_);
  local_20.length_ = (IntType)HalfCycles::max();
  bVar1 = WrappedInt<HalfCycles>::operator==(&local_18,(HalfCycles *)&local_20);
  if (bVar1) {
    local_28.length_ = (IntType)HalfCycles::max();
    (this->time_until_event_).super_WrappedInt<HalfCycles>.length_ = local_28.length_;
  }
  else {
    HalfCycles::HalfCycles(&local_38,0x28cc55);
    local_30.length_ = (IntType)WrappedInt<HalfCycles>::operator*(&local_18,&local_38);
    (this->time_until_event_).super_WrappedInt<HalfCycles>.length_ = local_30.length_;
  }
  HalfCycles::HalfCycles(&local_40,0);
  bVar1 = WrappedInt<HalfCycles>::operator>
                    (&(this->time_until_event_).super_WrappedInt<HalfCycles>,&local_40);
  if (!bVar1) {
    __assert_fail("time_until_event_ > LocalTimeScale(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/../../../ClockReceiver/JustInTime.hpp"
                  ,0x102,
                  "void JustInTimeActor<Motorola::MFP68901::MFP68901, HalfCycles, 819200, 2673749>::update_sequence_point() [T = Motorola::MFP68901::MFP68901, LocalTimeScale = HalfCycles, multiplier = 819200, divider = 2673749]"
                 );
  }
  return;
}

Assistant:

void update_sequence_point() {
			if constexpr (has_sequence_points<T>::value) {
				// Keep a fast path where no conversions will be applied; if conversions are
				// going to be applied then do a direct max -> max translation rather than
				// allowing the arithmetic to overflow.
				if constexpr (divider == 1 && std::is_same_v<LocalTimeScale, TargetTimeScale>) {
					time_until_event_ = object_.next_sequence_point();
				} else {
					const auto time = object_.next_sequence_point();
					if(time == TargetTimeScale::max()) {
						time_until_event_ = LocalTimeScale::max();
					} else {
						time_until_event_ = time * divider;
					}
				}
				assert(time_until_event_ > LocalTimeScale(0));
			}
		}